

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::FIShortDecoder::decode(FIShortDecoder *this,uint8_t *data,size_t len)

{
  DeadlyImportError *this_00;
  ulong in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_Assimp::FIValue> sVar1;
  undefined1 local_78 [30];
  int16_t v;
  size_t i;
  size_t numShorts;
  vector<short,_std::allocator<short>_> value;
  size_t len_local;
  uint8_t *data_local;
  FIShortDecoder *this_local;
  
  if ((in_RCX & 1) != 0) {
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    DeadlyImportError::DeadlyImportError(this_00,(string *)parseErrorMessage_abi_cxx11_);
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  std::vector<short,_std::allocator<short>_>::vector
            ((vector<short,_std::allocator<short>_> *)&numShorts);
  i = in_RCX >> 1;
  std::vector<short,_std::allocator<short>_>::reserve
            ((vector<short,_std::allocator<short>_> *)&numShorts,i);
  len_local = len;
  for (stack0xffffffffffffffa0 = (pointer)0x0; stack0xffffffffffffffa0 < i;
      register0x00000000 = (pointer)((long)stack0xffffffffffffffa0 + 1)) {
    local_78._22_2_ = CONCAT11(*(undefined1 *)len_local,*(undefined1 *)(len_local + 1));
    std::vector<short,_std::allocator<short>_>::push_back
              ((vector<short,_std::allocator<short>_> *)&numShorts,
               (value_type_conflict9 *)(local_78 + 0x16));
    len_local = len_local + 2;
  }
  FIShortValue::create((FIShortValue *)local_78,(vector<short,_std::allocator<short>_> *)&numShorts)
  ;
  std::shared_ptr<Assimp::FIValue_const>::shared_ptr<Assimp::FIShortValue,void>
            ((shared_ptr<Assimp::FIValue_const> *)this,(shared_ptr<Assimp::FIShortValue> *)local_78)
  ;
  std::shared_ptr<Assimp::FIShortValue>::~shared_ptr((shared_ptr<Assimp::FIShortValue> *)local_78);
  std::vector<short,_std::allocator<short>_>::~vector
            ((vector<short,_std::allocator<short>_> *)&numShorts);
  sVar1.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_Assimp::FIValue>)
         sVar1.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<const FIValue> decode(const uint8_t *data, size_t len) /*override*/ {
        if (len & 1) {
            throw DeadlyImportError(parseErrorMessage);
        }
        std::vector<int16_t> value;
        size_t numShorts = len / 2;
        value.reserve(numShorts);
        for (size_t i = 0; i < numShorts; ++i) {
            int16_t v = (data[0] << 8) | data[1];
            value.push_back(v);
            data += 2;
        }
        return FIShortValue::create(std::move(value));
    }